

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention_x86_fma::create_pipeline(MultiHeadAttention_x86_fma *this,Option *_opt)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int *piVar3;
  Allocator *pAVar4;
  Layer *pLVar5;
  long lVar6;
  int iVar7;
  ParamDict pd_4;
  ParamDict pd_1;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  int local_1a0;
  undefined1 auStack_19c [4];
  undefined1 local_198 [8];
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  int iStack_184;
  int local_180;
  undefined1 auStack_17c [4];
  undefined1 local_178 [16];
  ParamDict pd;
  undefined1 auStack_158 [8];
  int iStack_150;
  undefined1 uStack_14c;
  undefined1 uStack_14b;
  undefined1 uStack_14a;
  undefined1 uStack_149;
  Allocator *local_148 [3];
  int aiStack_130 [2];
  size_t local_128;
  void *local_120;
  int *piStack_118;
  size_t local_110;
  int local_108;
  Allocator *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  size_t local_e0;
  _func_int **local_d8;
  int *piStack_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  int local_a0;
  size_t local_98;
  int local_8c;
  Option opt;
  ModelBinFromMatArray local_40;
  
  opt.lightmode = _opt->lightmode;
  opt.use_shader_pack8 = _opt->use_shader_pack8;
  opt.use_subgroup_ops = _opt->use_subgroup_ops;
  opt.use_reserved_0 = _opt->use_reserved_0;
  opt.num_threads = _opt->num_threads;
  opt.blob_allocator = _opt->blob_allocator;
  opt.workspace_allocator = _opt->workspace_allocator;
  opt.openmp_blocktime = _opt->openmp_blocktime;
  opt.use_winograd_convolution = _opt->use_winograd_convolution;
  opt.use_sgemm_convolution = _opt->use_sgemm_convolution;
  opt.use_int8_inference = _opt->use_int8_inference;
  opt.use_vulkan_compute = _opt->use_vulkan_compute;
  opt.use_bf16_storage = _opt->use_bf16_storage;
  opt.use_fp16_packed = _opt->use_fp16_packed;
  opt.use_fp16_storage = _opt->use_fp16_storage;
  opt.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  opt.use_int8_packed = _opt->use_int8_packed;
  opt.use_int8_storage = _opt->use_int8_storage;
  opt.use_int8_arithmetic = _opt->use_int8_arithmetic;
  opt.use_packing_layout = _opt->use_packing_layout;
  opt.vulkan_device_index = _opt->vulkan_device_index;
  opt.use_reserved_1 = _opt->use_reserved_1;
  opt.use_image_storage = _opt->use_image_storage;
  opt.use_tensor_storage = _opt->use_tensor_storage;
  opt.use_reserved_2 = _opt->use_reserved_2;
  opt.flush_denormals = _opt->flush_denormals;
  opt.use_local_pool_allocator = _opt->use_local_pool_allocator;
  opt.use_shader_local_memory = _opt->use_shader_local_memory;
  opt.use_cooperative_matrix = _opt->use_cooperative_matrix;
  opt.use_winograd23_convolution = _opt->use_winograd23_convolution;
  opt.use_winograd43_convolution = _opt->use_winograd43_convolution;
  opt.use_winograd63_convolution = _opt->use_winograd63_convolution;
  opt.use_a53_a55_optimized_kernel = _opt->use_a53_a55_optimized_kernel;
  opt.use_fp16_uniform = _opt->use_fp16_uniform;
  opt.use_int8_uniform = _opt->use_int8_uniform;
  opt.use_reserved_9 = _opt->use_reserved_9;
  opt.use_reserved_10 = _opt->use_reserved_10;
  opt.use_reserved_11 = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    (this->super_MultiHeadAttention).super_Layer.support_packing = false;
    opt._32_8_ = opt._32_8_ & 0xffffffffffffff;
  }
  pLVar5 = create_layer_cpu(0x20);
  this->qk_softmax = pLVar5;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,-1);
  ParamDict::set(&pd,1,1);
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar5 = this->qk_softmax;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_1,(Mat *)0x0);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&pd_1);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_1);
  (*this->qk_softmax->_vptr_Layer[4])();
  ParamDict::~ParamDict(&pd);
  iVar7 = (this->super_MultiHeadAttention).weight_data_size /
          (this->super_MultiHeadAttention).embed_dim;
  pLVar5 = create_layer_cpu(0x4a);
  this->q_gemm = pLVar5;
  ParamDict::ParamDict(&pd_1);
  ParamDict::set(&pd_1,0,(this->super_MultiHeadAttention).scale);
  ParamDict::set(&pd_1,1,1.0);
  ParamDict::set(&pd_1,2,0);
  ParamDict::set(&pd_1,3,1);
  ParamDict::set(&pd_1,4,1);
  ParamDict::set(&pd_1,5,0);
  ParamDict::set(&pd_1,6,1);
  ParamDict::set(&pd_1,7,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set(&pd_1,8,0);
  ParamDict::set(&pd_1,9,iVar7);
  ParamDict::set(&pd_1,10,1);
  ParamDict::set(&pd_1,0xb,0);
  ParamDict::set(&pd_1,0xc,1);
  ParamDict::set(&pd_1,0xe,0);
  ParamDict::set(&pd_1,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,&pd_1);
  lVar6 = 0x40;
  local_8c = iVar7;
  do {
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&local_1a8 + lVar6) = 0;
    *(undefined8 *)(auStack_19c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_19c + lVar6) = 0;
    *(undefined8 *)(local_198 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&iStack_188 + lVar6) = 0;
    *(undefined8 *)(auStack_17c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_17c + lVar6) = 0;
    *(undefined8 *)(local_178 + lVar6 + 4) = 0;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).q_weight_data;
  if ((Mat *)&pd != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).q_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (pd.d != (ParamDictPrivate *)0x0) {
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type == 0) {
        if (local_148[0] == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_148[0]->_vptr_Allocator[3])();
        }
      }
    }
    pd._vptr_ParamDict = (_func_int **)(this->super_MultiHeadAttention).q_weight_data.data;
    pd.d = (ParamDictPrivate *)(this->super_MultiHeadAttention).q_weight_data.refcount;
    auStack_158 = (undefined1  [8])(this->super_MultiHeadAttention).q_weight_data.elemsize;
    iStack_150 = (this->super_MultiHeadAttention).q_weight_data.elempack;
    local_148[0] = (this->super_MultiHeadAttention).q_weight_data.allocator;
    local_148[1]._0_4_ = (this->super_MultiHeadAttention).q_weight_data.dims;
    local_148[1]._4_4_ = (this->super_MultiHeadAttention).q_weight_data.w;
    local_148[2]._0_4_ = (this->super_MultiHeadAttention).q_weight_data.h;
    local_148[2]._4_4_ = (this->super_MultiHeadAttention).q_weight_data.d;
    aiStack_130[0] = (this->super_MultiHeadAttention).q_weight_data.c;
    local_128 = (this->super_MultiHeadAttention).q_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).q_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).q_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          free(local_120);
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).q_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).q_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).q_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).q_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).q_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).q_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).q_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).q_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).q_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).q_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).q_bias_data.cstep;
  }
  if ((Mat *)&local_d8 != &(this->super_MultiHeadAttention).q_weight_data_int8_scales) {
    piVar3 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_d0 != (int *)0x0) {
      LOCK();
      *piStack_d0 = *piStack_d0 + -1;
      UNLOCK();
      if (*piStack_d0 == 0) {
        if (local_b8 == (Allocator *)0x0) {
          free(local_d8);
        }
        else {
          (*local_b8->_vptr_Allocator[3])();
        }
      }
    }
    local_d8 = (_func_int **)(this->super_MultiHeadAttention).q_weight_data_int8_scales.data;
    piStack_d0 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.refcount;
    local_c8 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.elemsize;
    local_c0 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.elempack;
    local_b8 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.allocator;
    local_b0._0_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.dims;
    local_b0._4_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.w;
    uStack_a8._0_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.h;
    uStack_a8._4_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.d;
    local_a0 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.c;
    local_98 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.cstep;
  }
  pLVar5 = this->q_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_4,(Mat *)&pd);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&pd_4);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_4);
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,&opt);
  if (opt.lightmode != false) {
    piVar3 = (this->super_MultiHeadAttention).q_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).q_weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).q_weight_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).q_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).q_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).q_weight_data.c = 0;
    (this->super_MultiHeadAttention).q_weight_data.dims = 0;
    (this->super_MultiHeadAttention).q_weight_data.w = 0;
    (this->super_MultiHeadAttention).q_weight_data.h = 0;
    (this->super_MultiHeadAttention).q_weight_data.d = 0;
    piVar3 = (this->super_MultiHeadAttention).q_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).q_bias_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).q_bias_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).q_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).q_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).q_bias_data.dims = 0;
    (this->super_MultiHeadAttention).q_bias_data.w = 0;
    (this->super_MultiHeadAttention).q_bias_data.h = 0;
    (this->super_MultiHeadAttention).q_bias_data.d = 0;
    (this->super_MultiHeadAttention).q_bias_data.c = 0;
  }
  lVar6 = 0x90;
  do {
    piVar3 = *(int **)((long)&pd.d + lVar6);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)((long)local_148 + lVar6) == (long *)0x0) {
          free(*(void **)((long)&pd._vptr_ParamDict + lVar6));
        }
        else {
          (**(code **)(**(long **)((long)local_148 + lVar6) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_128 + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6 + 4) = 0;
    *(undefined8 *)(auStack_158 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6) = 0;
    *(undefined4 *)((long)aiStack_130 + lVar6) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 8) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 0x10) = 0;
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != -0x48);
  ParamDict::~ParamDict(&pd_1);
  pLVar5 = create_layer_cpu(0x4a);
  this->k_gemm = pLVar5;
  ParamDict::ParamDict(&pd_1);
  ParamDict::set(&pd_1,2,0);
  ParamDict::set(&pd_1,3,1);
  ParamDict::set(&pd_1,4,1);
  ParamDict::set(&pd_1,5,0);
  ParamDict::set(&pd_1,6,1);
  ParamDict::set(&pd_1,7,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set(&pd_1,8,0);
  ParamDict::set(&pd_1,9,(this->super_MultiHeadAttention).kdim);
  ParamDict::set(&pd_1,10,1);
  ParamDict::set(&pd_1,0xb,0);
  ParamDict::set(&pd_1,0xc,1);
  ParamDict::set(&pd_1,0xe,0);
  ParamDict::set(&pd_1,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,&pd_1);
  lVar6 = 0x40;
  do {
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&local_1a8 + lVar6) = 0;
    *(undefined8 *)(auStack_19c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_19c + lVar6) = 0;
    *(undefined8 *)(local_198 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&iStack_188 + lVar6) = 0;
    *(undefined8 *)(auStack_17c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_17c + lVar6) = 0;
    *(undefined8 *)(local_178 + lVar6 + 4) = 0;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).k_weight_data;
  if ((Mat *)&pd != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).k_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (pd.d != (ParamDictPrivate *)0x0) {
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type == 0) {
        if (local_148[0] == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_148[0]->_vptr_Allocator[3])();
        }
      }
    }
    pd._vptr_ParamDict = (_func_int **)(this->super_MultiHeadAttention).k_weight_data.data;
    pd.d = (ParamDictPrivate *)(this->super_MultiHeadAttention).k_weight_data.refcount;
    auStack_158 = (undefined1  [8])(this->super_MultiHeadAttention).k_weight_data.elemsize;
    iStack_150 = (this->super_MultiHeadAttention).k_weight_data.elempack;
    local_148[0] = (this->super_MultiHeadAttention).k_weight_data.allocator;
    local_148[1]._0_4_ = (this->super_MultiHeadAttention).k_weight_data.dims;
    local_148[1]._4_4_ = (this->super_MultiHeadAttention).k_weight_data.w;
    local_148[2]._0_4_ = (this->super_MultiHeadAttention).k_weight_data.h;
    local_148[2]._4_4_ = (this->super_MultiHeadAttention).k_weight_data.d;
    aiStack_130[0] = (this->super_MultiHeadAttention).k_weight_data.c;
    local_128 = (this->super_MultiHeadAttention).k_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).k_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).k_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          free(local_120);
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).k_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).k_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).k_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).k_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).k_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).k_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).k_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).k_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).k_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).k_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).k_bias_data.cstep;
  }
  if ((Mat *)&local_d8 != &(this->super_MultiHeadAttention).k_weight_data_int8_scales) {
    piVar3 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_d0 != (int *)0x0) {
      LOCK();
      *piStack_d0 = *piStack_d0 + -1;
      UNLOCK();
      if (*piStack_d0 == 0) {
        if (local_b8 == (Allocator *)0x0) {
          free(local_d8);
        }
        else {
          (*local_b8->_vptr_Allocator[3])();
        }
      }
    }
    local_d8 = (_func_int **)(this->super_MultiHeadAttention).k_weight_data_int8_scales.data;
    piStack_d0 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.refcount;
    local_c8 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.elemsize;
    local_c0 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.elempack;
    local_b8 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.allocator;
    local_b0._0_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.dims;
    local_b0._4_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.w;
    uStack_a8._0_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.h;
    uStack_a8._4_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.d;
    local_a0 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.c;
    local_98 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.cstep;
  }
  pLVar5 = this->k_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_4,(Mat *)&pd);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&pd_4);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_4);
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,&opt);
  if (opt.lightmode != false) {
    piVar3 = (this->super_MultiHeadAttention).k_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).k_weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).k_weight_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).k_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).k_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).k_weight_data.c = 0;
    (this->super_MultiHeadAttention).k_weight_data.dims = 0;
    (this->super_MultiHeadAttention).k_weight_data.w = 0;
    (this->super_MultiHeadAttention).k_weight_data.h = 0;
    (this->super_MultiHeadAttention).k_weight_data.d = 0;
    piVar3 = (this->super_MultiHeadAttention).k_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).k_bias_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).k_bias_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).k_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).k_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).k_bias_data.dims = 0;
    (this->super_MultiHeadAttention).k_bias_data.w = 0;
    (this->super_MultiHeadAttention).k_bias_data.h = 0;
    (this->super_MultiHeadAttention).k_bias_data.d = 0;
    (this->super_MultiHeadAttention).k_bias_data.c = 0;
  }
  lVar6 = 0x90;
  do {
    piVar3 = *(int **)((long)&pd.d + lVar6);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)((long)local_148 + lVar6) == (long *)0x0) {
          free(*(void **)((long)&pd._vptr_ParamDict + lVar6));
        }
        else {
          (**(code **)(**(long **)((long)local_148 + lVar6) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_128 + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6 + 4) = 0;
    *(undefined8 *)(auStack_158 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6) = 0;
    *(undefined4 *)((long)aiStack_130 + lVar6) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 8) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 0x10) = 0;
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != -0x48);
  ParamDict::~ParamDict(&pd_1);
  pLVar5 = create_layer_cpu(0x4a);
  this->v_gemm = pLVar5;
  ParamDict::ParamDict(&pd_1);
  ParamDict::set(&pd_1,2,0);
  ParamDict::set(&pd_1,3,1);
  ParamDict::set(&pd_1,4,1);
  ParamDict::set(&pd_1,5,0);
  ParamDict::set(&pd_1,6,1);
  ParamDict::set(&pd_1,7,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set(&pd_1,8,0);
  ParamDict::set(&pd_1,9,(this->super_MultiHeadAttention).vdim);
  ParamDict::set(&pd_1,10,1);
  ParamDict::set(&pd_1,0xb,0);
  ParamDict::set(&pd_1,0xc,1);
  ParamDict::set(&pd_1,0xe,0);
  ParamDict::set(&pd_1,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,&pd_1);
  lVar6 = 0x40;
  do {
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&local_1a8 + lVar6) = 0;
    *(undefined8 *)(auStack_19c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_19c + lVar6) = 0;
    *(undefined8 *)(local_198 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&iStack_188 + lVar6) = 0;
    *(undefined8 *)(auStack_17c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_17c + lVar6) = 0;
    *(undefined8 *)(local_178 + lVar6 + 4) = 0;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).v_weight_data;
  if ((Mat *)&pd != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).v_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (pd.d != (ParamDictPrivate *)0x0) {
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type == 0) {
        if (local_148[0] == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_148[0]->_vptr_Allocator[3])();
        }
      }
    }
    pd._vptr_ParamDict = (_func_int **)(this->super_MultiHeadAttention).v_weight_data.data;
    pd.d = (ParamDictPrivate *)(this->super_MultiHeadAttention).v_weight_data.refcount;
    auStack_158 = (undefined1  [8])(this->super_MultiHeadAttention).v_weight_data.elemsize;
    iStack_150 = (this->super_MultiHeadAttention).v_weight_data.elempack;
    local_148[0] = (this->super_MultiHeadAttention).v_weight_data.allocator;
    local_148[1]._0_4_ = (this->super_MultiHeadAttention).v_weight_data.dims;
    local_148[1]._4_4_ = (this->super_MultiHeadAttention).v_weight_data.w;
    local_148[2]._0_4_ = (this->super_MultiHeadAttention).v_weight_data.h;
    local_148[2]._4_4_ = (this->super_MultiHeadAttention).v_weight_data.d;
    aiStack_130[0] = (this->super_MultiHeadAttention).v_weight_data.c;
    local_128 = (this->super_MultiHeadAttention).v_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).v_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).v_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          free(local_120);
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).v_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).v_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).v_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).v_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).v_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).v_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).v_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).v_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).v_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).v_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).v_bias_data.cstep;
  }
  if ((Mat *)&local_d8 != &(this->super_MultiHeadAttention).v_weight_data_int8_scales) {
    piVar3 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_d0 != (int *)0x0) {
      LOCK();
      *piStack_d0 = *piStack_d0 + -1;
      UNLOCK();
      if (*piStack_d0 == 0) {
        if (local_b8 == (Allocator *)0x0) {
          free(local_d8);
        }
        else {
          (*local_b8->_vptr_Allocator[3])();
        }
      }
    }
    local_d8 = (_func_int **)(this->super_MultiHeadAttention).v_weight_data_int8_scales.data;
    piStack_d0 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.refcount;
    local_c8 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.elemsize;
    local_c0 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.elempack;
    local_b8 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.allocator;
    local_b0._0_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.dims;
    local_b0._4_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.w;
    uStack_a8._0_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.h;
    uStack_a8._4_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.d;
    local_a0 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.c;
    local_98 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.cstep;
  }
  pLVar5 = this->v_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_4,(Mat *)&pd);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&pd_4);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_4);
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,&opt);
  if (opt.lightmode != false) {
    piVar3 = (this->super_MultiHeadAttention).v_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).v_weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).v_weight_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).v_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).v_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).v_weight_data.c = 0;
    (this->super_MultiHeadAttention).v_weight_data.dims = 0;
    (this->super_MultiHeadAttention).v_weight_data.w = 0;
    (this->super_MultiHeadAttention).v_weight_data.h = 0;
    (this->super_MultiHeadAttention).v_weight_data.d = 0;
    piVar3 = (this->super_MultiHeadAttention).v_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).v_bias_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).v_bias_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).v_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).v_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).v_bias_data.dims = 0;
    (this->super_MultiHeadAttention).v_bias_data.w = 0;
    (this->super_MultiHeadAttention).v_bias_data.h = 0;
    (this->super_MultiHeadAttention).v_bias_data.d = 0;
    (this->super_MultiHeadAttention).v_bias_data.c = 0;
  }
  iVar7 = local_8c;
  lVar6 = 0x90;
  do {
    piVar3 = *(int **)((long)&pd.d + lVar6);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)((long)local_148 + lVar6) == (long *)0x0) {
          free(*(void **)((long)&pd._vptr_ParamDict + lVar6));
        }
        else {
          (**(code **)(**(long **)((long)local_148 + lVar6) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_128 + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6 + 4) = 0;
    *(undefined8 *)(auStack_158 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6) = 0;
    *(undefined4 *)((long)aiStack_130 + lVar6) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 8) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 0x10) = 0;
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != -0x48);
  ParamDict::~ParamDict(&pd_1);
  pLVar5 = create_layer_cpu(0x4a);
  this->o_gemm = pLVar5;
  ParamDict::ParamDict(&pd_4);
  ParamDict::set(&pd_4,2,1);
  ParamDict::set(&pd_4,3,1);
  ParamDict::set(&pd_4,4,0);
  ParamDict::set(&pd_4,5,1);
  ParamDict::set(&pd_4,6,1);
  ParamDict::set(&pd_4,7,0);
  ParamDict::set(&pd_4,8,iVar7);
  ParamDict::set(&pd_4,9,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set(&pd_4,10,4);
  ParamDict::set(&pd_4,0xb,0);
  ParamDict::set(&pd_4,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,&pd_4);
  lVar6 = 0x40;
  do {
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&local_1a8 + lVar6) = 0;
    *(undefined8 *)(auStack_19c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_19c + lVar6) = 0;
    *(undefined8 *)(local_198 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&iStack_188 + lVar6) = 0;
    *(undefined8 *)(auStack_17c + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_17c + lVar6) = 0;
    *(undefined8 *)(local_178 + lVar6 + 4) = 0;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).out_weight_data;
  if ((Mat *)&pd != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).out_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (pd.d != (ParamDictPrivate *)0x0) {
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type == 0) {
        if (local_148[0] == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_148[0]->_vptr_Allocator[3])();
        }
      }
    }
    pd._vptr_ParamDict = (_func_int **)(this->super_MultiHeadAttention).out_weight_data.data;
    pd.d = (ParamDictPrivate *)(this->super_MultiHeadAttention).out_weight_data.refcount;
    auStack_158 = (undefined1  [8])(this->super_MultiHeadAttention).out_weight_data.elemsize;
    iStack_150 = (this->super_MultiHeadAttention).out_weight_data.elempack;
    local_148[0] = (this->super_MultiHeadAttention).out_weight_data.allocator;
    local_148[1]._0_4_ = (this->super_MultiHeadAttention).out_weight_data.dims;
    local_148[1]._4_4_ = (this->super_MultiHeadAttention).out_weight_data.w;
    local_148[2]._0_4_ = (this->super_MultiHeadAttention).out_weight_data.h;
    local_148[2]._4_4_ = (this->super_MultiHeadAttention).out_weight_data.d;
    aiStack_130[0] = (this->super_MultiHeadAttention).out_weight_data.c;
    local_128 = (this->super_MultiHeadAttention).out_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).out_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).out_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          free(local_120);
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).out_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).out_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).out_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).out_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).out_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).out_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).out_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).out_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).out_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).out_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).out_bias_data.cstep;
  }
  local_178._0_8_ = 0;
  pd_1._vptr_ParamDict = (_func_int **)0x0;
  pd_1.d._0_4_ = 0;
  pd_1.d._4_4_ = 0;
  local_1a8 = 0;
  uStack_1a4 = 0;
  local_1a0 = 0;
  local_198 = (undefined1  [8])0x0;
  iStack_190 = 0;
  iStack_18c = 0;
  iStack_188 = 0;
  iStack_184 = 0;
  local_180 = 0;
  Mat::create((Mat *)&pd_1,1,4,(Allocator *)0x0);
  *(float *)pd_1._vptr_ParamDict = (this->super_MultiHeadAttention).out_weight_data_int8_scale;
  piVar3 = (int *)CONCAT44(pd_1.d._4_4_,pd_1.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (piStack_d0 != (int *)0x0) {
    LOCK();
    *piStack_d0 = *piStack_d0 + -1;
    UNLOCK();
    if (*piStack_d0 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        free(local_d8);
      }
      else {
        (*local_b8->_vptr_Allocator[3])();
      }
    }
  }
  piStack_d0 = (int *)CONCAT44(pd_1.d._4_4_,pd_1.d._0_4_);
  local_d8 = pd_1._vptr_ParamDict;
  local_c8 = CONCAT44(uStack_1a4,local_1a8);
  local_c0 = local_1a0;
  local_b8 = (Allocator *)local_198;
  local_b0 = CONCAT44(iStack_18c,iStack_190);
  uStack_a8 = CONCAT44(iStack_184,iStack_188);
  local_a0 = local_180;
  local_98 = local_178._0_8_;
  pLVar5 = this->o_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,&opt);
  if (opt.lightmode == true) {
    piVar3 = (this->super_MultiHeadAttention).out_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).out_weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).out_weight_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).out_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).out_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).out_weight_data.c = 0;
    (this->super_MultiHeadAttention).out_weight_data.dims = 0;
    (this->super_MultiHeadAttention).out_weight_data.w = 0;
    (this->super_MultiHeadAttention).out_weight_data.h = 0;
    (this->super_MultiHeadAttention).out_weight_data.d = 0;
    piVar3 = (this->super_MultiHeadAttention).out_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_MultiHeadAttention).out_bias_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_MultiHeadAttention).out_bias_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).out_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).out_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).out_bias_data.dims = 0;
    (this->super_MultiHeadAttention).out_bias_data.w = 0;
    (this->super_MultiHeadAttention).out_bias_data.h = 0;
    (this->super_MultiHeadAttention).out_bias_data.d = 0;
    (this->super_MultiHeadAttention).out_bias_data.c = 0;
  }
  piVar3 = (int *)CONCAT44(pd_1.d._4_4_,pd_1.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_198 == (undefined1  [8])0x0) {
        free(pd_1._vptr_ParamDict);
      }
      else {
        (*(*(_func_int ***)local_198)[3])();
      }
    }
  }
  lVar6 = 0x90;
  do {
    piVar3 = *(int **)((long)&pd.d + lVar6);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)((long)local_148 + lVar6) == (long *)0x0) {
          free(*(void **)((long)&pd._vptr_ParamDict + lVar6));
        }
        else {
          (**(code **)(**(long **)((long)local_148 + lVar6) + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_128 + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6 + 4) = 0;
    *(undefined8 *)(auStack_158 + lVar6 + 4) = 0;
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
    *(undefined8 *)((long)&pd.d + lVar6) = 0;
    *(undefined4 *)((long)aiStack_130 + lVar6) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 8) = 0;
    *(undefined8 *)((long)local_148 + lVar6 + 0x10) = 0;
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != -0x48);
  ParamDict::~ParamDict(&pd_4);
  pLVar5 = create_layer_cpu(0x4a);
  this->qk_gemm = pLVar5;
  ParamDict::ParamDict(&pd_1);
  ParamDict::set(&pd_1,2,1);
  ParamDict::set(&pd_1,3,0);
  ParamDict::set(&pd_1,4,0);
  ParamDict::set(&pd_1,5,0);
  ParamDict::set(&pd_1,6,(uint)((this->super_MultiHeadAttention).attn_mask == 0));
  ParamDict::set(&pd_1,7,0);
  ParamDict::set(&pd_1,8,0);
  ParamDict::set(&pd_1,9,0);
  ParamDict::set(&pd_1,10,-(uint)((this->super_MultiHeadAttention).attn_mask == 0) | 3);
  ParamDict::set(&pd_1,0xb,0);
  ParamDict::set(&pd_1,0xc,1);
  ParamDict::set(&pd_1,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar5 = this->qk_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd,(Mat *)0x0);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&pd);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd);
  pd.d = (ParamDictPrivate *)opt.blob_allocator;
  auStack_158 = (undefined1  [8])opt.workspace_allocator;
  iStack_150 = opt.openmp_blocktime;
  uStack_14c = opt.use_winograd_convolution;
  uStack_14b = opt.use_sgemm_convolution;
  uStack_14a = opt.use_int8_inference;
  uStack_149 = opt.use_vulkan_compute;
  local_148[0] = (Allocator *)opt._32_8_;
  local_148[1] = (Allocator *)opt._40_8_;
  local_148[2] = (Allocator *)opt._48_8_;
  aiStack_130 = (int  [2])opt._56_8_;
  pd._vptr_ParamDict._0_4_ = opt._0_4_;
  pd._vptr_ParamDict = (_func_int **)CONCAT44(1,pd._vptr_ParamDict._0_4_);
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&pd);
  ParamDict::~ParamDict(&pd_1);
  pLVar5 = create_layer_cpu(0x4a);
  this->qkv_gemm = pLVar5;
  ParamDict::ParamDict(&pd_1);
  ParamDict::set(&pd_1,2,0);
  ParamDict::set(&pd_1,3,1);
  ParamDict::set(&pd_1,4,0);
  ParamDict::set(&pd_1,5,0);
  ParamDict::set(&pd_1,6,1);
  ParamDict::set(&pd_1,7,0);
  ParamDict::set(&pd_1,8,0);
  ParamDict::set(&pd_1,9,0);
  ParamDict::set(&pd_1,10,-1);
  ParamDict::set(&pd_1,0xb,0);
  ParamDict::set(&pd_1,0xc,1);
  ParamDict::set(&pd_1,0xe,1);
  ParamDict::set(&pd_1,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar5 = this->qkv_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd,(Mat *)0x0);
  (*pLVar5->_vptr_Layer[3])(pLVar5,&pd);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd);
  pd.d = (ParamDictPrivate *)opt.blob_allocator;
  auStack_158 = (undefined1  [8])opt.workspace_allocator;
  iStack_150 = opt.openmp_blocktime;
  uStack_14c = opt.use_winograd_convolution;
  uStack_14b = opt.use_sgemm_convolution;
  uStack_14a = opt.use_int8_inference;
  uStack_149 = opt.use_vulkan_compute;
  local_148[0] = (Allocator *)opt._32_8_;
  local_148[1] = (Allocator *)opt._40_8_;
  local_148[2] = (Allocator *)opt._48_8_;
  aiStack_130 = (int  [2])opt._56_8_;
  pd._vptr_ParamDict._0_4_ = opt._0_4_;
  pd._vptr_ParamDict = (_func_int **)CONCAT44(1,pd._vptr_ParamDict._0_4_);
  (*this->qkv_gemm->_vptr_Layer[4])(this->qkv_gemm,&pd);
  ParamDict::~ParamDict(&pd_1);
  return 0;
}

Assistant:

int MultiHeadAttention_x86_fma::create_pipeline(const Option& _opt)
{
    Option opt = _opt;
    if (int8_scale_term)
    {
        support_packing = false;

        opt.use_packing_layout = false; // TODO enable packing
    }

    {
        qk_softmax = ncnn::create_layer_cpu(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    const int qdim = weight_data_size / embed_dim;

    {
        q_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, scale);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, qdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        q_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
#if NCNN_INT8
        weights[2] = q_weight_data_int8_scales;
#endif
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        k_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
#if NCNN_INT8
        weights[2] = k_weight_data_int8_scales;
#endif
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        v_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
#if NCNN_INT8
        weights[2] = v_weight_data_int8_scales;
#endif
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        o_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, qdim);      // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        o_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
#if NCNN_INT8
        Mat out_weight_data_int8_scales(1);
        out_weight_data_int8_scales[0] = out_weight_data_int8_scale;
        weights[2] = out_weight_data_int8_scales;
#endif
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }

    {
        qkv_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    return 0;
}